

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref __thiscall cashew::ValueBuilder::makeContinue(ValueBuilder *this,IString label)

{
  Ref RVar1;
  Ref r;
  Value *this_00;
  undefined1 local_28 [8];
  IString label_local;
  
  local_28 = (undefined1  [8])this;
  label_local.str._M_len = label.str._M_len;
  RVar1 = makeRawArray(2);
  r = makeRawString((IString *)&CONTINUE);
  this_00 = Value::push_back(RVar1.inst,r);
  if (label.str._M_len == 0) {
    RVar1 = makeNull();
  }
  else {
    RVar1 = makeRawString((IString *)local_28);
  }
  RVar1.inst = Value::push_back(this_00,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeContinue(IString label) {
    return &makeRawArray(2)
              ->push_back(makeRawString(CONTINUE))
              .push_back(!!label ? makeRawString(label) : makeNull());
  }